

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this,QTextCursor *cursor)

{
  QPlainTextEditPrivate *this_00;
  QScrollBar *this_01;
  bool bVar1;
  bool bVar2;
  char cVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  double dVar11;
  qreal qVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  QRect QVar17;
  QRectF r;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  cVar3 = QTextCursor::isNull();
  if (cVar3 == '\0') {
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_00->control,cursor);
    dVar14 = (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
    dVar11 = 0.0;
    if (0.0 <= dVar14) {
      dVar11 = dVar14;
    }
    dVar13 = dVar14 + (dVar11 - dVar14);
    dVar15 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    bVar1 = 2147483647.0 < dVar15;
    if (dVar15 <= -2147483648.0) {
      dVar15 = -2147483648.0;
    }
    dVar15 = (double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar15);
    dVar16 = (double)(((ulong)local_58.yp._4_4_ & 0x80000000) << 0x20 | 0x3fe0000000000000) +
             (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
    bVar1 = 2147483647.0 < dVar16;
    if (dVar16 <= -2147483648.0) {
      dVar16 = -2147483648.0;
    }
    iVar8 = (int)dVar15;
    dVar16 = (double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar16);
    iVar7 = (int)dVar16;
    dVar14 = (dVar13 - (double)(int)dVar15) * 0.5 +
             ((double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_) - (dVar11 - dVar14));
    dVar14 = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    bVar1 = 2147483647.0 < dVar14;
    if (dVar14 <= -2147483648.0) {
      dVar14 = -2147483648.0;
    }
    dVar11 = ((double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_) - (double)(int)dVar16) * 0.5 +
             (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
    dVar11 = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
    bVar2 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    LVar4 = QWidget::layoutDirection
                      (*(QWidget **)
                        &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
    this_01 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar4 == RightToLeft) {
      iVar5 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar6 = QAbstractSlider::value
                        (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider)
      ;
      iVar5 = iVar5 - iVar6;
    }
    else {
      iVar5 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    qVar12 = QPlainTextEditPrivate::verticalOffset
                       (this_00,this_00->control->topBlock,this_00->topLine);
    iVar6 = (int)(qVar12 + this_00->topLineFracture);
    uVar9 = CONCAT44(iVar7 - iVar6,iVar8 - iVar5);
    uVar10 = CONCAT44((iVar7 + (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                            ~-(ulong)bVar2 & (ulong)dVar11) + -1) - iVar6,
                      (iVar8 + (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                            ~-(ulong)bVar1 & (ulong)dVar14) + -1) - iVar5);
  }
  else {
    uVar10 = 0xffffffffffffffff;
    uVar9 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar17.x2.m_i = (int)uVar10;
    QVar17.y2.m_i = (int)((ulong)uVar10 >> 0x20);
    QVar17.x1.m_i = (int)uVar9;
    QVar17.y1.m_i = (int)((ulong)uVar9 >> 0x20);
    return QVar17;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect(const QTextCursor &cursor) const
{
    Q_D(const QPlainTextEdit);
    if (cursor.isNull())
        return QRect();

    QRect r = d->control->cursorRect(cursor).toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}